

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O0

RGBFilm * pbrt::RGBFilm::Create
                    (ParameterDictionary *parameters,Float exposureTime,FilterHandle *filter,
                    RGBColorSpace *colorSpace,FileLoc *loc,Allocator alloc)

{
  byte bVar1;
  RGBFilm *pRVar2;
  char *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  undefined8 in_R8;
  Float FVar3;
  FilmBaseParameters filmBaseParameters;
  PixelSensor *sensor;
  bool writeFP16;
  FileLoc *in_stack_000000f8;
  Float in_stack_00000104;
  RGBColorSpace *in_stack_00000108;
  ParameterDictionary *in_stack_00000110;
  Allocator in_stack_00000118;
  Float maxComponentValue;
  FileLoc *in_stack_00000340;
  PixelSensor *in_stack_00000348;
  FilterHandle *in_stack_00000350;
  ParameterDictionary *in_stack_00000358;
  FilmBaseParameters *in_stack_00000360;
  string *in_stack_fffffffffffffea8;
  ParameterDictionary *in_stack_fffffffffffffeb0;
  polymorphic_allocator<std::byte> *args_4;
  bool *in_stack_fffffffffffffec0;
  undefined7 in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  FilmBaseParameters *args;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  FilterHandle local_100;
  polymorphic_allocator<std::byte> local_f8 [10];
  undefined8 local_a8;
  PixelSensor *local_a0;
  undefined1 local_91 [36];
  byte local_6d;
  allocator<char> local_59;
  string local_58 [36];
  Float local_34;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  undefined8 local_8;
  
  local_10 = in_RDI;
  local_8 = in_R8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_RDI,in_RSI,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  FVar3 = ParameterDictionary::GetOneFloat(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,0.0);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  args = (FilmBaseParameters *)local_91;
  args_1 = local_10;
  local_34 = FVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_RDI,in_RSI,(allocator<char> *)CONCAT44(FVar3,in_stack_fffffffffffffee0));
  bVar1 = ParameterDictionary::GetOneBool(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,false)
  ;
  std::__cxx11::string::~string((string *)(local_91 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_91);
  local_6d = bVar1 & 1;
  local_a8 = local_8;
  local_a0 = PixelSensor::Create(in_stack_00000110,in_stack_00000108,in_stack_00000104,
                                 in_stack_000000f8,in_stack_00000118);
  FilterHandle::FilterHandle(&local_100,(FilterHandle *)local_10);
  args_4 = local_f8;
  FilmBaseParameters::FilmBaseParameters
            (in_stack_00000360,in_stack_00000358,in_stack_00000350,in_stack_00000348,
             in_stack_00000340);
  pRVar2 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::RGBFilm,pbrt::FilmBaseParameters&,pbrt::RGBColorSpace_const*&,float&,bool&,pstd::pmr::polymorphic_allocator<std::byte>&>
                     ((polymorphic_allocator<std::byte> *)CONCAT44(FVar3,in_stack_fffffffffffffee0),
                      args,(RGBColorSpace **)args_1,
                      (float *)CONCAT17(bVar1,in_stack_fffffffffffffec8),in_stack_fffffffffffffec0,
                      args_4);
  FilmBaseParameters::~FilmBaseParameters((FilmBaseParameters *)0x6d63bc);
  return pRVar2;
}

Assistant:

RGBFilm *RGBFilm::Create(const ParameterDictionary &parameters, Float exposureTime,
                         FilterHandle filter, const RGBColorSpace *colorSpace,
                         const FileLoc *loc, Allocator alloc) {
    Float maxComponentValue = parameters.GetOneFloat("maxcomponentvalue", Infinity);
    bool writeFP16 = parameters.GetOneBool("savefp16", true);

    PixelSensor *sensor =
        PixelSensor::Create(parameters, colorSpace, exposureTime, loc, alloc);
    FilmBaseParameters filmBaseParameters(parameters, filter, sensor, loc);

    return alloc.new_object<RGBFilm>(filmBaseParameters, colorSpace, maxComponentValue,
                                     writeFP16, alloc);
}